

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O0

void irfft(int n,float *inp_cplx,float *out_real)

{
  value_type vVar1;
  reference pvVar2;
  size_type __n;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  float twiddle_imag;
  float twiddle_real;
  int m;
  int k;
  vector<float,_std::allocator<float>_> imag_output;
  vector<float,_std::allocator<float>_> real_output;
  int i;
  vector<float,_std::allocator<float>_> imag_input;
  vector<float,_std::allocator<float>_> real_input;
  int N;
  value_type in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffee8;
  value_type in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  size_type in_stack_fffffffffffffef8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  vector<float,_std::allocator<float>_> *this;
  int local_c0;
  float local_bc;
  float local_b8;
  int local_b4;
  int local_b0;
  undefined1 local_a9 [33];
  vector<float,_std::allocator<float>_> local_88;
  int local_70;
  vector<float,_std::allocator<float>_> local_68 [2];
  vector<float,_std::allocator<float>_> local_38;
  int local_1c;
  long local_18;
  long local_10;
  int local_4;
  
  local_1c = in_EDI / 2 + 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::allocator<float>::allocator((allocator<float> *)0x183986);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::allocator<float>::~allocator((allocator<float> *)0x1839ac);
  std::allocator<float>::allocator((allocator<float> *)0x1839cb);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::allocator<float>::~allocator((allocator<float> *)0x1839f1);
  for (local_70 = 0; local_70 < local_1c; local_70 = local_70 + 1) {
    vVar1 = *(value_type *)(local_10 + (long)(local_70 << 1) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_70);
    *pvVar2 = vVar1;
    vVar1 = *(value_type *)(local_10 + (long)(local_70 * 2 + 1) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_68,(long)local_70);
    *pvVar2 = vVar1;
  }
  std::allocator<float>::allocator((allocator<float> *)0x183b10);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::allocator<float>::~allocator((allocator<float> *)0x183b36);
  __n = (size_type)local_4;
  this = (vector<float,_std::allocator<float>_> *)local_a9;
  std::allocator<float>::allocator((allocator<float> *)0x183b52);
  std::vector<float,_std::allocator<float>_>::vector
            (this,__n,(allocator_type *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::allocator<float>::~allocator((allocator<float> *)0x183b75);
  for (local_b0 = 0; local_b0 < local_4; local_b0 = local_b0 + 1) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_88,(long)local_b0);
    *pvVar2 = 0.0;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_a9 + 1),(long)local_b0);
    *pvVar2 = 0.0;
    for (local_b4 = 0; local_b4 < local_1c; local_b4 = local_b4 + 1) {
      twiddle((float *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
              (float *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
              (int)in_stack_fffffffffffffee4,(int)in_stack_fffffffffffffee0);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_b4);
      in_stack_fffffffffffffee0 = *pvVar2;
      in_stack_fffffffffffffee4 = local_b8;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_68,(long)local_b4);
      in_stack_fffffffffffffee8 =
           in_stack_fffffffffffffee0 * in_stack_fffffffffffffee4 + -(*pvVar2 * local_bc);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_88,(long)local_b0);
      *pvVar2 = in_stack_fffffffffffffee8 + *pvVar2;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_b4);
      in_stack_fffffffffffffeec = *pvVar2;
      in_stack_fffffffffffffef0 = local_bc;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_68,(long)local_b4);
      in_stack_fffffffffffffef4 =
           in_stack_fffffffffffffeec * in_stack_fffffffffffffef0 + *pvVar2 * local_b8;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_a9 + 1),(long)local_b0);
      *pvVar2 = in_stack_fffffffffffffef4 + *pvVar2;
    }
  }
  for (local_c0 = 0; local_c0 < local_4; local_c0 = local_c0 + 1) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_88,(long)local_c0);
    *(float *)(local_18 + (long)local_c0 * 4) = *pvVar2 / (float)local_1c;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return;
}

Assistant:

static void irfft(int n, const float * inp_cplx, float * out_real) {
    int N = n / 2 + 1;

    std::vector<float> real_input(N);
    std::vector<float> imag_input(N);
    for (int i = 0; i < N; ++i) {
        real_input[i] = inp_cplx[2 * i];
        imag_input[i] = inp_cplx[2 * i + 1];
    }

    std::vector<float> real_output(n);
    std::vector<float> imag_output(n);

    for (int k = 0; k < n; ++k) {
        real_output[k] = 0.0f;
        imag_output[k] = 0.0f;
        for (int m = 0; m < N; ++m) {
            float twiddle_real;
            float twiddle_imag;

            twiddle(&twiddle_real, &twiddle_imag, k * m, n);

            real_output[k] += real_input[m] * twiddle_real - imag_input[m] * twiddle_imag;
            imag_output[k] += real_input[m] * twiddle_imag + imag_input[m] * twiddle_real;
        }
    }

    for (int i = 0; i < n; ++i) {
        out_real[i] = real_output[i] / N;
    }
}